

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O1

ErrorNumber
checkExpectedValue(TA_Real *data,TA_RetCode retCode,TA_RetCode expectedRetCode,uint outBegIdx,
                  uint expectedBegIdx,uint outNbElement,uint expectedNbElement,
                  TA_Real oneOfTheExpectedOutReal,uint oneOfTheExpectedOutRealIndex)

{
  ErrorNumber EVar1;
  
  if (retCode == expectedRetCode) {
    EVar1 = TA_TEST_PASS;
    if (retCode == TA_SUCCESS) {
      if (outNbElement < 0x119) {
        if (outNbElement == expectedNbElement) {
          EVar1 = TA_TEST_PASS;
          if (expectedNbElement != 0) {
            if ((oneOfTheExpectedOutReal <= data[oneOfTheExpectedOutRealIndex] + -0.01) ||
               (data[oneOfTheExpectedOutRealIndex] + 0.01 <= oneOfTheExpectedOutReal)) {
              printf("Fail: For index %d, Expected value = %f but calculate value is %f\n");
              EVar1 = TA_TESTUTIL_TFRR_BAD_CALCULATION;
            }
            else {
              EVar1 = TA_TEST_PASS;
              if (expectedBegIdx != outBegIdx) {
                printf("Fail: outBegIdx expected %d but got %d\n",(ulong)expectedBegIdx,
                       (ulong)outBegIdx);
                EVar1 = TA_TESTUTIL_TFRR_BAD_BEGIDX;
              }
            }
          }
        }
        else {
          printf("Fail: outNbElement expected %d but got %d\n",(ulong)expectedNbElement,
                 (ulong)outNbElement);
          EVar1 = TA_TESTUTIL_TFRR_BAD_OUTNBELEMENT;
        }
      }
      else {
        printf("Fail: outNbElement is out of range 2 (%d)\n",(ulong)outNbElement);
        EVar1 = TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
      }
    }
  }
  else {
    printf("Fail: RetCode %d different than expected %d\n");
    EVar1 = TA_TESTUTIL_TFRR_BAD_RETCODE;
  }
  return EVar1;
}

Assistant:

ErrorNumber checkExpectedValue( const TA_Real *data,
                                TA_RetCode retCode, TA_RetCode expectedRetCode,
                                unsigned int outBegIdx, unsigned int expectedBegIdx,
                                unsigned int outNbElement, unsigned int expectedNbElement,
                                TA_Real oneOfTheExpectedOutReal,
                                unsigned int oneOfTheExpectedOutRealIndex )
{
   if( retCode != expectedRetCode )
   {
      printf( "Fail: RetCode %d different than expected %d\n", retCode, expectedRetCode );
      return TA_TESTUTIL_TFRR_BAD_RETCODE;
   }

   if( retCode != TA_SUCCESS )
   {
      /* An error did occured, but it
       * was expected. No need to go
       * further.
       */
      return TA_TEST_PASS;
   }

   if( outNbElement > MAX_NB_TEST_ELEMENT )
   {
       printf( "Fail: outNbElement is out of range 2 (%d)\n", outNbElement );
       return TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
   }


   /* Make sure the range of output does not contains NAN. */
   /* TODO Add back nan/inf checking
   for( i=0; i < outNbElement; i++ )
   {
      if( trio_isnan(data[i]) )
      {
         printf( "Fail: Not a number find within the data (%d,%f)\n", i, data[i] );
         return TA_TEST_TFRR_OVERLAP_OR_NAN_3;
      }
   }*/

   /* Verify that the expected output is there. */

   if( outNbElement != expectedNbElement )
   {
      printf( "Fail: outNbElement expected %d but got %d\n",
              expectedNbElement, outNbElement );
      return TA_TESTUTIL_TFRR_BAD_OUTNBELEMENT;
   }

   if( expectedNbElement > 0 )
   {
      if( !TA_REAL_EQ( oneOfTheExpectedOutReal, data[oneOfTheExpectedOutRealIndex], 0.01 ) )
      {
         printf( "Fail: For index %d, Expected value = %f but calculate value is %f\n",
                 oneOfTheExpectedOutRealIndex,
                 oneOfTheExpectedOutReal,
                 data[oneOfTheExpectedOutRealIndex] );
         return TA_TESTUTIL_TFRR_BAD_CALCULATION;
      }

      if( expectedBegIdx != outBegIdx )
      {
         printf( "Fail: outBegIdx expected %d but got %d\n", expectedBegIdx, outBegIdx );
         return TA_TESTUTIL_TFRR_BAD_BEGIDX;
      }
   }

   /* Succeed. */
   return TA_TEST_PASS;
}